

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forkfd.c
# Opt level: O1

int forkfd_fork_fallback(int flags,pid_t *ppid)

{
  ffd_atomic_int *pfVar1;
  ProcessInfo *pPVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  __pid_t _Var6;
  int iVar7;
  BigArray *__ptr;
  BigArray *pBVar8;
  int *piVar9;
  ssize_t sVar10;
  ulong uVar11;
  SmallArray *pSVar12;
  BigArray *pBVar13;
  ProcessInfo *pPVar14;
  long in_FS_OFFSET;
  bool bVar15;
  eventfd_t val64;
  int sync_pipe [2];
  int death_pipe [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  pthread_once(&forkfd_initialization,forkfd_initialize);
  LOCK();
  iVar4 = children.header.busyCount + 1;
  UNLOCK();
  bVar15 = children.header.busyCount < 0x10;
  children.header.busyCount = iVar4;
  if (bVar15) {
    LOCK();
    bVar15 = children.entries[0].pid == 0;
    if (bVar15) {
      children.entries[0].pid = -1;
    }
    UNLOCK();
    if (bVar15) {
      pPVar14 = children.entries;
      bVar15 = true;
    }
    else {
      uVar11 = 0xffffffffffffffff;
      pPVar14 = children.entries;
      do {
        pPVar14 = pPVar14 + 1;
        if (uVar11 == 0xe) {
          uVar11 = 0xf;
          pPVar14 = children.entries;
          break;
        }
        uVar11 = uVar11 + 1;
        LOCK();
        bVar15 = pPVar14->pid == 0;
        if (bVar15) {
          pPVar14->pid = -1;
        }
        UNLOCK();
      } while (!bVar15);
      bVar15 = uVar11 < 0xf;
    }
    if (!bVar15) goto LAB_00448b65;
  }
  else {
LAB_00448b65:
    LOCK();
    children.header.busyCount = children.header.busyCount + -1;
    UNLOCK();
    pPVar14 = (ProcessInfo *)0x0;
  }
  pSVar12 = &children;
  do {
    if (pPVar14 != (ProcessInfo *)0x0) goto LAB_00448c4f;
    pBVar13 = (((BigArray *)pSVar12)->header).nextArray;
    if (pBVar13 == (BigArray *)0x0) {
      __ptr = (BigArray *)calloc(1,0x810);
      if (__ptr == (BigArray *)0x0) {
        pBVar13 = (BigArray *)0x0;
      }
      else {
        LOCK();
        pBVar8 = (((BigArray *)pSVar12)->header).nextArray;
        bVar15 = pBVar8 == (BigArray *)0x0;
        if (bVar15) {
          (((BigArray *)pSVar12)->header).nextArray = __ptr;
          pBVar8 = pBVar13;
        }
        UNLOCK();
        pBVar13 = __ptr;
        if (!bVar15) {
          free(__ptr);
          pBVar13 = pBVar8;
        }
      }
      if (__ptr != (BigArray *)0x0) goto LAB_00448bc9;
      pPVar14 = (ProcessInfo *)0x0;
      bVar3 = false;
    }
    else {
LAB_00448bc9:
      pSVar12 = (SmallArray *)pBVar13;
      LOCK();
      pfVar1 = &(((BigArray *)pSVar12)->header).busyCount;
      iVar4 = *pfVar1;
      *pfVar1 = *pfVar1 + 1;
      UNLOCK();
      if (iVar4 < 0x100) {
        pPVar2 = ((BigArray *)pSVar12)->entries;
        LOCK();
        bVar15 = pPVar2->pid == 0;
        if (bVar15) {
          pPVar2->pid = -1;
        }
        UNLOCK();
        bVar3 = true;
        if (bVar15) {
          bVar15 = true;
          pPVar14 = pPVar2;
        }
        else {
          pPVar14 = ((BigArray *)pSVar12)->entries;
          uVar11 = 0xffffffffffffffff;
          do {
            pPVar14 = pPVar14 + 1;
            if (uVar11 == 0xfe) {
              uVar11 = 0xff;
              pPVar14 = pPVar2;
              break;
            }
            uVar11 = uVar11 + 1;
            LOCK();
            bVar15 = pPVar14->pid == 0;
            if (bVar15) {
              pPVar14->pid = -1;
            }
            UNLOCK();
          } while (!bVar15);
          bVar15 = uVar11 < 0xff;
        }
        if (bVar15) goto LAB_00448c3e;
      }
      LOCK();
      pfVar1 = &(((BigArray *)pSVar12)->header).busyCount;
      *pfVar1 = *pfVar1 + -1;
      UNLOCK();
      bVar3 = true;
      pPVar14 = (ProcessInfo *)0x0;
    }
LAB_00448c3e:
  } while (bVar3);
  pSVar12 = (SmallArray *)&DAT_aaaaaaaaaaaaaaaa;
  pPVar14 = (ProcessInfo *)0x0;
LAB_00448c4f:
  if (pPVar14 == (ProcessInfo *)0x0) {
    piVar9 = __errno_location();
    *piVar9 = 0xc;
  }
  else {
    iVar4 = create_pipe((int *)&local_40,flags);
    if (iVar4 != -1) {
      iVar4 = eventfd(0,0x80000);
      if ((iVar4 != -1) || (iVar5 = pipe2((int *)&local_48,0x80000), iVar5 != -1)) {
        _Var6 = fork();
        if (_Var6 != -1) {
          if (ppid != (pid_t *)0x0) {
            *ppid = _Var6;
          }
          if (_Var6 == 0) {
            if (iVar4 == -1) {
              local_50 = (undefined1 *)CONCAT71(local_50._1_7_,0xaa);
              do {
                iVar4 = close(local_48._4_4_);
                if (iVar4 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              do {
                sVar10 = read((int)local_48,&local_50,1);
                if ((int)sVar10 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              do {
                iVar4 = close((int)local_48);
                if (iVar4 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
            }
            else {
              local_50 = &DAT_aaaaaaaaaaaaaaaa;
              do {
                iVar5 = eventfd_read(iVar4,(eventfd_t *)&local_50);
                if (iVar5 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              do {
                iVar5 = close(iVar4);
                if (iVar5 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
            }
            do {
              iVar4 = close((int)local_40);
              if (iVar4 != -1) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            iVar5 = -2;
            do {
              iVar4 = close(local_40._4_4_);
              if (iVar4 != -1) break;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
          }
          else {
            pPVar14->deathPipe = local_40._4_4_;
            iVar5 = (int)local_40;
            pPVar14->pid = _Var6;
            if (iVar4 == -1) {
              do {
                iVar4 = close((int)local_48);
                if (iVar4 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              do {
                sVar10 = write(local_48._4_4_,"",1);
                if ((int)sVar10 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              do {
                iVar4 = close(local_48._4_4_);
                if (iVar4 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
            }
            else {
              do {
                iVar7 = eventfd_write(iVar4,0x2a);
                if (iVar7 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              do {
                iVar7 = close(iVar4);
                if (iVar7 != -1) break;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
            }
          }
          goto LAB_00448e13;
        }
        if (iVar4 == -1) {
          do {
            iVar4 = close((int)local_48);
            if (iVar4 != -1) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
          do {
            iVar4 = close(local_48._4_4_);
            if (iVar4 != -1) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
        }
        else {
          do {
            iVar5 = close(iVar4);
            if (iVar5 != -1) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
        }
      }
      do {
        iVar4 = close((int)local_40);
        if (iVar4 != -1) break;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
      do {
        iVar4 = close(local_40._4_4_);
        if (iVar4 != -1) break;
        piVar9 = __errno_location();
      } while (*piVar9 == 4);
    }
    pPVar14->deathPipe = -1;
    pPVar14->pid = 0;
    LOCK();
    pfVar1 = &(((BigArray *)pSVar12)->header).busyCount;
    *pfVar1 = *pfVar1 + -1;
    UNLOCK();
  }
  iVar5 = -1;
LAB_00448e13:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

static int forkfd_fork_fallback(int flags, pid_t *ppid)
{
    Header *header;
    ProcessInfo *info;
    pid_t pid;
    int fd = -1;
    int death_pipe[2];
    int sync_pipe[2];
    int ret;
    int efd = -1;

    (void) pthread_once(&forkfd_initialization, forkfd_initialize);

    info = allocateInfo(&header);
    if (info == NULL) {
        errno = ENOMEM;
        return -1;
    }

    /* create the pipes before we fork */
    if (create_pipe(death_pipe, flags) == -1)
        goto err_free; /* failed to create the pipes, pass errno */

#ifdef HAVE_EVENTFD
    /* try using an eventfd, which consumes less resources */
    efd = eventfd(0, EFD_CLOEXEC);
#endif
    if (efd == -1) {
        /* try a pipe */
        if (create_pipe(sync_pipe, FFD_CLOEXEC) == -1) {
            /* failed both at eventfd and pipe; fail and pass errno */
            goto err_close;
        }
    }

    /* now fork */
    pid = fork();
    if (pid == -1)
        goto err_close2; /* failed to fork, pass errno */
    if (ppid)
        *ppid = pid;

    /*
     * We need to store the child's PID in the info structure, so
     * the SIGCHLD handler knows that this child is present and it
     * knows the writing end of the pipe to pass information on.
     * However, the child process could exit before we stored the
     * information (or the handler could run for other children exiting).
     * We prevent that from happening by blocking the child process in
     * a read(2) until we're finished storing the information.
     */
    if (pid == 0) {
        /* this is the child process */
        /* first, wait for the all clear */
        if (efd != -1) {
#ifdef HAVE_EVENTFD
            eventfd_t val64;
            EINTR_LOOP(ret, eventfd_read(efd, &val64));
            EINTR_LOOP(ret, close(efd));
#endif
        } else {
            char c;
            EINTR_LOOP(ret, close(sync_pipe[1]));
            EINTR_LOOP(ret, read(sync_pipe[0], &c, sizeof c));
            EINTR_LOOP(ret, close(sync_pipe[0]));
        }

        /* now close the pipes and return to the caller */
        EINTR_LOOP(ret, close(death_pipe[0]));
        EINTR_LOOP(ret, close(death_pipe[1]));
        fd = FFD_CHILD_PROCESS;
    } else {
        /* parent process */
        info->deathPipe = death_pipe[1];
        fd = death_pipe[0];
        ffd_atomic_store(&info->pid, pid, FFD_ATOMIC_RELEASE);

        /* release the child */
#ifdef HAVE_EVENTFD
        if (efd != -1) {
            eventfd_t val64 = 42;
            EINTR_LOOP(ret, eventfd_write(efd, val64));
            EINTR_LOOP(ret, close(efd));
        } else
#endif
        {
            /*
             * Usually, closing would be enough to make read(2) return and the child process
             * continue. We need to write here: another thread could be calling forkfd at the
             * same time, which means auxpipe[1] might be open in another child process.
             */
            EINTR_LOOP(ret, close(sync_pipe[0]));
            EINTR_LOOP(ret, write(sync_pipe[1], "", 1));
            EINTR_LOOP(ret, close(sync_pipe[1]));
        }
    }

    return fd;

err_close2:
#ifdef HAVE_EVENTFD
    if (efd != -1) {
        EINTR_LOOP(ret, close(efd));
    } else
#endif
    {
        EINTR_LOOP(ret, close(sync_pipe[0]));
        EINTR_LOOP(ret, close(sync_pipe[1]));
    }
err_close:
    EINTR_LOOP(ret, close(death_pipe[0]));
    EINTR_LOOP(ret, close(death_pipe[1]));
err_free:
    /* free the info pointer */
    freeInfo(header, info);
    return -1;
}